

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool PIT_CheckThing(FMultiBlockThingsIterator *it,CheckResult *cres,FBoundingBox *box,
                   FCheckPosition *tm)

{
  double *pdVar1;
  byte *pbVar2;
  uint uVar3;
  AActor *other;
  PClass *pPVar4;
  player_t *ppVar5;
  AActor *pAVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AActor *pAVar12;
  Node *pNVar13;
  Node *pNVar14;
  byte bVar15;
  AActor *pAVar16;
  long lVar17;
  VMFunction *pVVar18;
  FString *this;
  undefined8 *in_FS_OFFSET;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int retval;
  DVector3 oldpos;
  VMReturn ret;
  undefined1 local_cc [4];
  undefined1 local_c8 [44];
  char local_9c [12];
  undefined1 local_90 [24];
  FName local_78;
  FName local_74;
  FName local_70;
  FName local_6c;
  FSoundID local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  other = cres->thing;
  pAVar12 = tm->thing;
  if (other == pAVar12) {
    return true;
  }
  if ((((other->flags).Value & 7) == 0) && (((other->flags6).Value & 0x200) == 0)) {
    return true;
  }
  dVar19 = other->radius + pAVar12->radius;
  if (dVar19 <= ABS((other->__Pos).X - (cres->Position).X)) {
    return true;
  }
  if (dVar19 <= ABS((other->__Pos).Y - (cres->Position).Y)) {
    return true;
  }
  if ((((other->flags2).Value | (pAVar12->flags2).Value) >> 0x14 & 1) != 0) {
    return true;
  }
  if (((pAVar12->flags6).Value & 2) != 0) {
    AActor::GetSpecies((AActor *)local_c8);
    AActor::GetSpecies((AActor *)local_90);
    if (local_c8._0_4_ == local_90._0_4_) {
      return true;
    }
  }
  pAVar12 = tm->thing;
  pAVar12->BlockingMobj = other;
  dVar19 = (other->__Pos).Z + other->Height;
  if ((cres->portalflags & 0x80) == 0) {
    if ((((((byte)i_compatflags & 0x10) == 0) && (((pAVar12->flags).Value & 0x1014200) == 0)) &&
        (((other->flags).Value & 2) != 0)) &&
       (((((other->flags4).Value & 0x80) != 0 && (((pAVar12->flags3).Value & 0x2000) != 0)) &&
        ((tm->floorz <= dVar19 && (dVar19 <= (pAVar12->__Pos).Z + pAVar12->MaxStepHeight)))))) {
      tm->stepthing = other;
      tm->floorz = dVar19;
    }
    if (((tm->FromPMove == false) && (pAVar12->player == (player_t *)0x0)) ||
       (((other->flags).Value & 2) == 0)) goto LAB_00409b52;
    AActor::PosRelative((DVector3 *)local_c8,pAVar12,other);
    dVar21 = (tm->pos).X;
    pAVar12 = tm->thing;
    if ((dVar21 != (pAVar12->__Pos).X) || (NAN(dVar21) || NAN((pAVar12->__Pos).X))) {
LAB_00409b93:
      dVar21 = (other->__Pos).X;
      dVar22 = other->radius + pAVar12->radius;
      if ((ABS(dVar21 - (double)local_c8._0_8_) < dVar22) &&
         (dVar20 = (other->__Pos).Y, ABS(dVar20 - (double)local_c8._8_8_) < dVar22)) {
        dVar21 = dVar21 - (cres->Position).X;
        dVar20 = dVar20 - (cres->Position).Y;
        dVar21 = c_sqrt(dVar20 * dVar20 + dVar21 * dVar21);
        dVar20 = (other->__Pos).X - (double)local_c8._0_8_;
        dVar22 = (other->__Pos).Y - (double)local_c8._8_8_;
        dVar22 = c_sqrt(dVar22 * dVar22 + dVar20 * dVar20);
        if (dVar22 < dVar21) {
          pAVar12 = tm->thing;
          dVar21 = (pAVar12->__Pos).Z;
          dVar22 = pAVar12->Height + dVar21;
          pdVar1 = &(other->__Pos).Z;
          if ((dVar22 < *pdVar1 || dVar22 == *pdVar1) || (bVar15 = 1, dVar19 <= dVar21)) {
            bVar15 = (byte)((other->flags3).Value >> 8) & (byte)((pAVar12->flags3).Value >> 8) & 1;
          }
          goto LAB_00409c8b;
        }
      }
      bVar15 = 0;
    }
    else {
      dVar21 = (tm->pos).Y;
      bVar15 = 1;
      pdVar1 = &(pAVar12->__Pos).Y;
      if ((dVar21 != *pdVar1) || (NAN(dVar21) || NAN(*pdVar1))) goto LAB_00409b93;
    }
  }
  else {
LAB_00409b52:
    bVar15 = 0;
  }
LAB_00409c8b:
  pAVar12 = tm->thing;
  uVar11 = (pAVar12->flags2).Value;
  if (((((uVar11 >> 0xc & 1) != 0) || (((other->flags4).Value & 0x80) != 0)) &&
      (((byte)i_compatflags & 0x10) == 0)) &&
     (((((uVar11 >> 8 & 1) == 0 || (((pAVar12->flags).Value & 0x10000) == 0)) ||
       ((((other->flags5).Value & 0x80000) != 0 ||
        ((((pAVar12->flags6).Value & 1) != 0 && (((other->flags2).Value & 0x8000) != 0)))))) &&
      ((((other->flags3).Value & (pAVar12->flags3).Value) >> 8 & 1) == 0)))) {
    dVar21 = (pAVar12->__Pos).Z;
    if (dVar19 <= dVar21) {
      return true;
    }
    if (dVar21 + pAVar12->Height <= (other->__Pos).Z) {
      return true;
    }
  }
  if (((((other->flags).Value & 2) != 0) || (((other->flags6).Value & 0x220) != 0)) &&
     (((uVar11 & 8) != 0 || ((pAVar12->flags).Value & 0x10002) != 0 ||
      ((((pAVar12->flags6).Value & 0x80000) != 0 || (((pAVar12->BounceFlags).Value & 0x1000) != 0)))
      ))) {
    if ((PIT_CheckThing::VIndex == 0xffffffff) &&
       (PIT_CheckThing::VIndex = GetVirtualIndex(AActor::RegistrationInfo.MyClass,"CanCollideWith"),
       PIT_CheckThing::VIndex == 0xffffffff)) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x4f0,
                    "bool PIT_CheckThing(FMultiBlockThingsIterator &, FMultiBlockThingsIterator::CheckResult &, const FBoundingBox &, FCheckPosition &)"
                   );
    }
    pAVar12 = tm->thing;
    local_c8._8_5_ = 0x300000001;
    local_c8._24_4_ = 1;
    local_c8[0x1c] = 3;
    local_c8._32_4_ = 0;
    local_9c[0] = 0;
    local_90._0_8_ = (AActor *)local_cc;
    local_90._8_2_ = 0;
    local_90[10] = '\0';
    local_c8._0_8_ = pAVar12;
    local_c8._16_8_ = other;
    if ((pAVar12->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar9 = (**(pAVar12->super_DThinker).super_DObject._vptr_DObject)(pAVar12);
      (pAVar12->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar9);
    }
    pPVar4 = (pAVar12->super_DThinker).super_DObject.Class;
    if (PIT_CheckThing::VIndex < (pPVar4->Virtuals).Count) {
      pVVar18 = (pPVar4->Virtuals).Array[PIT_CheckThing::VIndex];
    }
    else {
      pVVar18 = (VMFunction *)0x0;
    }
    if (pVVar18 == (VMFunction *)0x0) {
LAB_00409e3f:
      uVar7 = local_c8._0_8_;
      local_c8._0_8_ = local_c8._16_8_;
      local_c8._16_8_ = uVar7;
      local_c8._32_4_ = 1;
      if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar9 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
        (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar9);
      }
      pPVar4 = (other->super_DThinker).super_DObject.Class;
      if (PIT_CheckThing::VIndex < (pPVar4->Virtuals).Count) {
        pVVar18 = (pPVar4->Virtuals).Array[PIT_CheckThing::VIndex];
      }
      else {
        pVVar18 = (VMFunction *)0x0;
      }
      if (pVVar18 != (VMFunction *)0x0) {
        GlobalVMStack::__tls_init();
        VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,pVVar18,(VMValue *)local_c8,3,
                           (VMReturn *)local_90,1,(VMException **)0x0);
        if (local_cc == (undefined1  [4])0x0) goto LAB_00409ee5;
      }
      bVar8 = true;
    }
    else {
      GlobalVMStack::__tls_init();
      VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,pVVar18,(VMValue *)local_c8,3,
                         (VMReturn *)local_90,1,(VMException **)0x0);
      if (local_cc != (undefined1  [4])0x0) goto LAB_00409e3f;
LAB_00409ee5:
      bVar8 = false;
    }
    lVar17 = -0x30;
    this = (FString *)(local_c8 + 0x20);
    do {
      if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
        FString::~FString(this);
      }
      this = this + -2;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0);
    if (!bVar8) {
      return true;
    }
  }
  ppVar5 = tm->thing->player;
  if ((ppVar5 == (player_t *)0x0) || ((ppVar5->cheats & 0x2000) == 0)) {
    uVar11 = (other->flags6).Value;
    if ((((uVar11 >> 9 & 1) != 0) && ((((tm->thing->flags).Value & 2) != 0 && (0 < other->health))))
       && (((uVar11 >> 0xd & 1) != 0 || (bVar8 = AActor::IsSentient(other), bVar8)))) {
      if (other->player == (player_t *)0x0) {
        if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar9 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar9);
        }
        pPVar4 = (other->super_DThinker).super_DObject.Class;
        pAVar12 = tm->thing;
        if ((pAVar12->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar9 = (**(pAVar12->super_DThinker).super_DObject._vptr_DObject)(pAVar12);
          (pAVar12->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar9);
        }
        if (pPVar4 == (pAVar12->super_DThinker).super_DObject.Class) goto LAB_0040a0b1;
      }
      if (((other->flags6).Value & 0x40) != 0) {
        AActor::GetSpecies((AActor *)local_c8);
        AActor::GetSpecies((AActor *)local_90);
        if (local_c8._0_4_ == local_90._0_4_) goto LAB_0040a0b1;
      }
      pAVar12 = tm->thing;
      dVar21 = (pAVar12->__Pos).Z;
      if ((dVar21 <= dVar19) && ((other->__Pos).Z <= dVar21 + pAVar12->Height)) {
        pAVar16 = (other->master).field_0.p;
        if ((pAVar16 != (AActor *)0x0) &&
           (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (other->master).field_0.p = (AActor *)0x0;
          pAVar16 = (AActor *)0x0;
        }
        if (pAVar16 != pAVar12) {
          pAVar12 = (tm->thing->master).field_0.p;
          if ((pAVar12 != (AActor *)0x0) &&
             (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (tm->thing->master).field_0.p = (AActor *)0x0;
            pAVar12 = (AActor *)0x0;
          }
          if (pAVar12 != other) {
            pbVar2 = (byte *)((long)&(other->flags6).Value + 1);
            *pbVar2 = *pbVar2 & 0xdf;
            local_5c.Index = 0;
            local_38.Degrees = 0.0;
            P_DamageMobj(other,(AActor *)0x0,(AActor *)0x0,other->health,&local_5c,8,&local_38);
            return true;
          }
        }
      }
    }
LAB_0040a0b1:
    if ((((other->flags6).Value & 0x20) != 0) &&
       ((((pAVar12 = tm->thing, pAVar12->player != (player_t *)0x0 ||
          (((other->activationtype & 8U) != 0 && (((pAVar12->flags3).Value & 0x2000) != 0)))) ||
         (((other->activationtype & 0x10U) != 0 && (((pAVar12->flags).Value & 0x10000) != 0)))) &&
        ((other->lastbump < level.maptime &&
         (bVar8 = P_ActivateThingSpecial(other,pAVar12,false), bVar8)))))) {
      other->lastbump = level.maptime + 0x23;
    }
  }
  pAVar12 = tm->thing;
  uVar11 = (pAVar12->flags).Value;
  if ((uVar11 >> 0x18 & 1) != 0) {
    bVar8 = AActor::CallSlam(pAVar12,pAVar12->BlockingMobj);
    tm->thing->BlockingMobj = (AActor *)0x0;
    return bVar8;
  }
  if ((pAVar12->player == (player_t *)0x0) || ((pAVar12->player->cheats & 0x2000) == 0)) {
    uVar3 = (pAVar12->flags2).Value;
    if (((uVar3 & 8) != 0) &&
       (((((other->flags).Value & 4) != 0 && (((other->flags2).Value & 0x8000) == 0)) &&
        (((other->flags3).Value & 0x12000) == 0x2000)))) {
      dVar21 = (pAVar12->Vel).X + (other->Vel).X;
      dVar19 = (pAVar12->Vel).Y;
      (other->Vel).X = dVar21;
      dVar19 = dVar19 + (other->Vel).Y;
      (other->Vel).Y = dVar19;
      if (ABS(dVar19) + ABS(dVar21) <= 3.0) {
        return false;
      }
      iVar9 = pAVar12->Mass / 100 + 1;
      local_60.Index = (pAVar12->DamageType).super_FName.Index;
      local_40.Degrees = 0.0;
      iVar10 = P_DamageMobj(other,pAVar12,pAVar12,iVar9,&local_60,0,&local_40);
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      P_TraceBleed(iVar9,other,tm->thing);
      iVar9 = other->Mass / 100 + 1;
      local_64.Index = (tm->thing->DamageType).super_FName.Index;
      local_48.Degrees = 0.0;
      iVar10 = P_DamageMobj(tm->thing,other,other,iVar9 >> 2,&local_64,0,&local_48);
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      P_TraceBleed(iVar9,tm->thing,other);
      return false;
    }
    if (((uVar11 >> 0x10 & 1) != 0) ||
       (((uVar11 & 2) == 0 && (((pAVar12->BounceFlags).Value & 0x1000) != 0)))) {
      if (((other->flags2).Value & 0x4000000) != 0) {
        return true;
      }
      if (((uVar3 >> 0xe & 1) != 0) && (((other->flags3).Value & 8) != 0)) {
        return true;
      }
      if ((((pAVar12->flags6).Value & 4) != 0) &&
         (pAVar16 = (pAVar12->target).field_0.p, pAVar16 != (AActor *)0x0)) {
        if (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          AActor::GetSpecies((AActor *)local_c8);
          AActor::GetSpecies((AActor *)local_90);
          if (local_c8._0_4_ == local_90._0_4_) {
            return true;
          }
        }
        else {
          (pAVar12->target).field_0.p = (AActor *)0x0;
        }
      }
      uVar11 = (other->flags).Value;
      if ((((uVar11 >> 0x14 & 1) != 0) && ((uVar11 & 4) == 0)) &&
         (((tm->thing->flags2).Value & 0x100) != 0)) {
        return true;
      }
      dVar19 = other->projectilepassheight;
      if (dVar19 <= 0.0) {
        if ((0.0 <= dVar19) || ((i_compatflags._2_1_ & 8) == 0)) {
          dVar19 = other->Height;
        }
        else {
          dVar19 = -dVar19;
        }
      }
      pAVar12 = tm->thing;
      dVar21 = (pAVar12->__Pos).Z;
      dVar22 = (other->__Pos).Z;
      if (dVar19 + dVar22 < dVar21) {
        return true;
      }
      if (dVar21 + pAVar12->Height < dVar22) {
        return true;
      }
      if ((((pAVar12->BounceFlags).Value & 8) != 0) &&
         (((pAVar12->DamageVal == 0 && (pAVar12->DamageFunc == (VMFunction *)0x0)) ||
          (((pAVar12->flags).Value & 0x10000) == 0)))) {
        pAVar16 = (pAVar12->target).field_0.p;
        if ((pAVar16 != (AActor *)0x0) &&
           (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar12->target).field_0.p = (AActor *)0x0;
          pAVar16 = (AActor *)0x0;
        }
        if (pAVar16 == other) {
          return true;
        }
LAB_0040a665:
        return (uVar11 & 2) == 0;
      }
      iVar9 = AActor::SpecialMissileHit(pAVar12,other);
      if (iVar9 != 0) {
        if (iVar9 == 1) {
          return true;
        }
        pAVar12 = (tm->thing->target).field_0.p;
        if (pAVar12 != (AActor *)0x0) {
          if (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            pAVar12 = (tm->thing->target).field_0.p;
            if ((pAVar12 != (AActor *)0x0) &&
               (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (tm->thing->target).field_0.p = (AActor *)0x0;
              pAVar12 = (AActor *)0x0;
            }
            if (other == pAVar12) {
              return true;
            }
            pAVar12 = (tm->thing->target).field_0.p;
            if ((pAVar12 != (AActor *)0x0) &&
               (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (tm->thing->target).field_0.p = (AActor *)0x0;
              pAVar12 = (AActor *)0x0;
            }
            bVar8 = CanAttackHurt(other,pAVar12);
            if (!bVar8) {
              return false;
            }
          }
          else {
            (tm->thing->target).field_0.p = (AActor *)0x0;
          }
        }
        uVar11 = (other->flags).Value;
        if ((uVar11 & 4) == 0) goto LAB_0040a665;
        if ((((other->flags4).Value & 0x40000) != 0) && (((tm->thing->flags4).Value & 0x40000) == 0)
           ) {
          return true;
        }
        if ((tm->DoRipping == true) && (((other->flags5).Value & 0x80000) == 0)) {
          pAVar12 = tm->thing;
          if ((((other->RipLevelMin < 1) || (other->RipLevelMin <= pAVar12->RipperLevel)) &&
              ((other->RipLevelMax < 1 || (pAVar12->RipperLevel <= other->RipLevelMax)))) &&
             ((((pAVar12->flags6).Value & 1) == 0 || (((other->flags2).Value & 0x8000) == 0)))) {
            pNVar14 = (tm->LastRipped).Nodes + ((tm->LastRipped).Size - 1 & (uint)other);
            while ((pNVar13 = pNVar14, pNVar13 != (Node *)0x0 && (pNVar13->Next != (Node *)0x1))) {
              pNVar14 = pNVar13->Next;
              if ((pNVar13->Pair).Key == other) {
LAB_0040a91e:
                if ((pNVar13 == (Node *)0x0) || ((pNVar13->Pair).Value == false)) {
                  pNVar14 = TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::
                            GetNode(&tm->LastRipped,other);
                  (pNVar14->Pair).Value = true;
                  if ((((other->flags).Value & 0x80000) == 0) &&
                     ((uVar11 = (other->flags2).Value, -1 < (int)uVar11 &&
                      ((uVar11 & 0x18000000) == 0 && ((tm->thing->flags3).Value & 0x8000000) == 0)))
                     ) {
                    P_RipperBlood(tm->thing,other);
                  }
                  pAVar12 = tm->thing;
                  local_68.ID = S_FindSound("misc/ripslop");
                  S_Sound(pAVar12,4,&local_68,1.0,1.001);
                  pAVar12 = tm->thing;
                  if (0 < pAVar12->PoisonDamage) {
                    pAVar16 = (pAVar12->target).field_0.p;
                    if ((pAVar16 != (AActor *)0x0) &&
                       (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                      (pAVar12->target).field_0.p = (AActor *)0x0;
                      pAVar16 = (AActor *)0x0;
                    }
                    pAVar6 = tm->thing;
                    local_6c.Index = (pAVar6->PoisonDamageType).super_FName.Index;
                    P_PoisonMobj(other,pAVar12,pAVar16,pAVar6->PoisonDamage,pAVar6->PoisonDuration,
                                 pAVar6->PoisonPeriod,&local_6c);
                  }
                  iVar9 = AActor::GetMissileDamage(tm->thing,3,2);
                  pAVar12 = tm->thing;
                  pAVar16 = (pAVar12->target).field_0.p;
                  if ((pAVar16 != (AActor *)0x0) &&
                     (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (pAVar12->target).field_0.p = (AActor *)0x0;
                    pAVar16 = (AActor *)0x0;
                  }
                  local_70.Index = (tm->thing->DamageType).super_FName.Index;
                  local_50.Degrees = 0.0;
                  iVar10 = P_DamageMobj(other,pAVar12,pAVar16,iVar9,&local_70,0,&local_50);
                  if (((tm->thing->flags3).Value & 0x8000000) == 0) {
                    if (0 < iVar10) {
                      iVar9 = iVar10;
                    }
                    P_TraceBleed(iVar9,other,tm->thing);
                  }
                  if (((((other->flags2).Value & 0x200) != 0) &&
                      (pAVar12 = tm->thing, ((pAVar12->flags2).Value & 0x2000) == 0)) &&
                     (iVar9 = tm->PushTime, other->lastpush != iVar9)) {
                    dVar19 = other->pushfactor;
                    dVar21 = (pAVar12->Vel).Y;
                    (other->Vel).X = (pAVar12->Vel).X * dVar19 + (other->Vel).X;
                    (other->Vel).Y = dVar19 * dVar21 + (other->Vel).Y;
                    other->lastpush = iVar9;
                  }
                }
                if (spechit.Count != 0) {
                  spechit.Count = 0;
                  return true;
                }
                return true;
              }
            }
            pNVar13 = (Node *)0x0;
            goto LAB_0040a91e;
          }
        }
        pAVar12 = tm->thing;
        if (0 < pAVar12->PoisonDamage) {
          pAVar16 = (pAVar12->target).field_0.p;
          if ((pAVar16 != (AActor *)0x0) &&
             (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (pAVar12->target).field_0.p = (AActor *)0x0;
            pAVar16 = (AActor *)0x0;
          }
          pAVar6 = tm->thing;
          local_74.Index = (pAVar6->PoisonDamageType).super_FName.Index;
          P_PoisonMobj(other,pAVar12,pAVar16,pAVar6->PoisonDamage,pAVar6->PoisonDuration,
                       pAVar6->PoisonPeriod,&local_74);
        }
        iVar9 = AActor::GetMissileDamage
                          (tm->thing,(uint)(((tm->thing->flags4).Value >> 8 & 1) == 0) * 4 + 3,1);
        if (((iVar9 < 1) && (((tm->thing->flags6).Value & 8) == 0)) &&
           (((tm->thing->flags7).Value & 0x400) == 0)) {
          P_GiveBody(other,-iVar9,0);
        }
        else {
          pAVar12 = tm->thing;
          pAVar16 = (pAVar12->target).field_0.p;
          if ((pAVar16 != (AActor *)0x0) &&
             (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (pAVar12->target).field_0.p = (AActor *)0x0;
            pAVar16 = (AActor *)0x0;
          }
          local_78.Index = (tm->thing->DamageType).super_FName.Index;
          local_58.Degrees = 0.0;
          iVar10 = P_DamageMobj(other,pAVar12,pAVar16,iVar9,&local_78,0,&local_58);
          if (0 < iVar9) {
            if ((((((tm->thing->flags5).Value & 0x100) != 0) &&
                 (((other->flags).Value & 0x80000) == 0)) &&
                (((other->flags2).Value & 0x98000000) == 0)) &&
               ((((tm->thing->flags3).Value & 0x8000000) == 0 &&
                (uVar11 = FRandom::GenRand32(&pr_checkthing), (~uVar11 & 0xc0) != 0)))) {
              pAVar12 = tm->thing;
              local_c8._0_8_ = (pAVar12->__Pos).X;
              local_c8._8_8_ = (pAVar12->__Pos).Y;
              local_c8._16_8_ = (pAVar12->__Pos).Z;
              AActor::AngleTo((AActor *)(local_90 + 0x10),pAVar12,SUB81(other,0));
              P_BloodSplatter((DVector3 *)local_c8,other,(DAngle *)(local_90 + 0x10));
            }
            if (((tm->thing->flags3).Value & 0x8000000) == 0) {
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              P_TraceBleed(iVar9,other,tm->thing);
            }
          }
        }
        if (((((other->flags7).Value & 0x800) != 0) && ((int)(other->flags2).Value < 0)) &&
           (pAVar12 = tm->thing, ((pAVar12->flags).Value & 0x10000) != 0)) {
          if (((pAVar12->flags2).Value & 0x40000000) != 0) {
            (pAVar12->tracer).field_0 = (pAVar12->target).field_0;
          }
          (tm->thing->target).field_0.p = other;
          return true;
        }
      }
      return false;
    }
    if ((((uVar3 >> 0xd & 1) == 0) && (((other->flags2).Value & 0x200) != 0)) &&
       (iVar9 = tm->PushTime, other->lastpush != iVar9)) {
      dVar19 = other->pushfactor;
      dVar21 = (pAVar12->Vel).Y;
      (other->Vel).X = (pAVar12->Vel).X * dVar19 + (other->Vel).X;
      (other->Vel).Y = dVar19 * dVar21 + (other->Vel).Y;
      other->lastpush = iVar9;
    }
    uVar3 = (other->flags).Value;
    bVar8 = true;
    if ((uVar3 & 0x1002) == 2) {
      if ((uVar11 & 2) == 0) {
        bVar8 = ((pAVar12->flags6).Value & 0x80000) == 0;
      }
      else {
        bVar8 = false;
      }
    }
    if (((uVar11 >> 0xb & 1) != 0 && (uVar3 & 1) != 0) &&
       (dVar19 = ((pAVar12->__Pos).Z + pAVar12->Height) - pAVar12->MaxStepHeight,
       pdVar1 = &(other->__Pos).Z, *pdVar1 <= dVar19 && dVar19 != *pdVar1)) {
      P_TouchSpecialThing(other,pAVar12);
    }
  }
  else {
    bVar8 = true;
    if (((other->flags).Value & 0x1002) == 2) {
      if ((uVar11 & 2) == 0) {
        bVar8 = ((pAVar12->flags6).Value & 0x80000) == 0;
      }
      else {
        bVar8 = false;
      }
    }
  }
  return (bool)(bVar15 | bVar8);
}

Assistant:

bool PIT_CheckThing(FMultiBlockThingsIterator &it, FMultiBlockThingsIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tm)
{
	AActor *thing = cres.thing;
	double topz;
	bool 	solid;
	int 	damage;

	// don't clip against self
	if (thing == tm.thing)
		return true;

	if (!((thing->flags & (MF_SOLID | MF_SPECIAL | MF_SHOOTABLE)) || thing->flags6 & MF6_TOUCHY))
		return true;	// can't hit thing

	double blockdist = thing->radius + tm.thing->radius;
	if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		return true;

	if ((thing->flags2 | tm.thing->flags2) & MF2_THRUACTORS)
		return true;

	if ((tm.thing->flags6 & MF6_THRUSPECIES) && (tm.thing->GetSpecies() == thing->GetSpecies()))
		return true;

	tm.thing->BlockingMobj = thing;
	topz = thing->Top();

	// Both things overlap in x or y direction
	bool unblocking = false;

	// walking on other actors and unblocking is too messy through restricted portal types so disable it.
	if (!(cres.portalflags & FFCF_RESTRICTEDPORTAL))
	{
		if (!(i_compatflags & COMPATF_NO_PASSMOBJ) && !(tm.thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY | MF_NOGRAVITY)) &&
			(thing->flags & MF_SOLID) && (thing->flags4 & MF4_ACTLIKEBRIDGE))
		{
			// [RH] Let monsters walk on actors as well as floors
			if ((tm.thing->flags3 & MF3_ISMONSTER) &&
				topz >= tm.floorz && topz <= tm.thing->Z() + tm.thing->MaxStepHeight)
			{
				// The commented-out if is an attempt to prevent monsters from walking off a
				// thing further than they would walk off a ledge. I can't think of an easy
				// way to do this, so I restrict them to only walking on bridges instead.
				// Uncommenting the if here makes it almost impossible for them to walk on
				// anything, bridge or otherwise.
				//			if (abs(thing->x - tmx) <= thing->radius &&
				//				abs(thing->y - tmy) <= thing->radius)
				{
					tm.stepthing = thing;
					tm.floorz = topz;
				}
			}
		}

		if (((tm.FromPMove || tm.thing->player != NULL) && thing->flags&MF_SOLID))
		{
			DVector3 oldpos = tm.thing->PosRelative(thing);
			// Both actors already overlap. To prevent them from remaining stuck allow the move if it
			// takes them further apart or the move does not change the position (when called from P_ChangeSector.)
			if (tm.pos.X == tm.thing->X() && tm.pos.Y == tm.thing->Y())
			{
				unblocking = true;
			}
			else if (fabs(thing->X() - oldpos.X) < (thing->radius + tm.thing->radius) &&
				fabs(thing->Y() - oldpos.Y) < (thing->radius + tm.thing->radius))

			{
				double newdist = thing->Distance2D(cres.Position.X, cres.Position.Y);
				double olddist = thing->Distance2D(oldpos.X, oldpos.Y);

				if (newdist > olddist)
				{
					// unblock only if there's already a vertical overlap (or both actors are flagged not to overlap)
					unblocking = (tm.thing->Top() > thing->Z() && tm.thing->Z() < topz) || (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP);
				}
			}
		}
	}

	// [RH] If the other thing is a bridge, then treat the moving thing as if it had MF2_PASSMOBJ, so
	// you can use a scrolling floor to move scenery items underneath a bridge.
	if ((tm.thing->flags2 & MF2_PASSMOBJ || thing->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
	{ // check if a mobj passed over/under another object
		if (!(tm.thing->flags & MF_MISSILE) ||
			!(tm.thing->flags2 & MF2_RIP) ||
			(thing->flags5 & MF5_DONTRIP) ||
			((tm.thing->flags6 & MF6_NOBOSSRIP) && (thing->flags2 & MF2_BOSS)))
		{
			// Some things prefer not to overlap each other, if possible (Q: Is this even needed anymore? It was just for dealing with some deficiencies in the code below in Heretic.)
			if (!(tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP))
			{
				if ((tm.thing->Z() >= topz) || (tm.thing->Top() <= thing->Z()))
					return true;
			}
			// If they are not allowed to overlap, the rest of this function still needs to be executed.
		}
	}

	// Call the script callback. This must be done before any other checks that perform some actual action or may already return a 'block'.
	// The checks here are to do this only for conditions that would later result in an action, calling this for everything would be too much of a drag if
	// too many scripted overrides were being used, as PIT_CheckThing is even called for touching all the monster corpses lying around.
	if (((thing->flags & MF_SOLID) || (thing->flags6 & (MF6_TOUCHY | MF6_BUMPSPECIAL))) && 
		((tm.thing->flags & (MF_SOLID|MF_MISSILE)) || (tm.thing->flags2 & MF2_BLASTED) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS) || (tm.thing->BounceFlags & BOUNCE_MBF)))
	{
		static unsigned VIndex = ~0u;
		if (VIndex == ~0u)
		{
			VIndex = GetVirtualIndex(RUNTIME_CLASS(AActor), "CanCollideWith");
			assert(VIndex != ~0u);
		}

		VMValue params[3] = { tm.thing, thing, false };
		VMReturn ret;
		int retval;
		ret.IntAt(&retval);

		auto clss = tm.thing->GetClass();
		VMFunction *func = clss->Virtuals.Size() > VIndex ? clss->Virtuals[VIndex] : nullptr;
		if (func != nullptr)
		{
			GlobalVMStack.Call(func, params, 3, &ret, 1, nullptr);
			if (!retval) return true;
		}
		std::swap(params[0].a, params[1].a);
		params[2].i = true;

		// re-get for the other actor.
		clss = thing->GetClass();
		func = clss->Virtuals.Size() > VIndex ? clss->Virtuals[VIndex] : nullptr;
		if (func != nullptr)
		{
			GlobalVMStack.Call(func, params, 3, &ret, 1, nullptr);
			if (!retval) return true;
		}
	}


	if (tm.thing->player == NULL || !(tm.thing->player->cheats & CF_PREDICTING))
	{
		// touchy object is alive, toucher is solid
		if (thing->flags6 & MF6_TOUCHY && tm.thing->flags & MF_SOLID && thing->health > 0 &&
			// Thing is an armed mine or a sentient thing
			(thing->flags6 & MF6_ARMED || thing->IsSentient()) &&
			// either different classes or players
			(thing->player || thing->GetClass() != tm.thing->GetClass()) &&
			// or different species if DONTHARMSPECIES
			(!(thing->flags6 & MF6_DONTHARMSPECIES) || thing->GetSpecies() != tm.thing->GetSpecies()) &&
			// touches vertically
			topz >= tm.thing->Z() && tm.thing->Top() >= thing->Z() &&
			// prevents lost souls from exploding when fired by pain elementals
			(thing->master != tm.thing && tm.thing->master != thing))
			// Difference with MBF: MBF hardcodes the LS/PE check and lets actors of the same species
			// but different classes trigger the touchiness, but that seems less straightforwards.
		{
			thing->flags6 &= ~MF6_ARMED; // Disarm
			P_DamageMobj(thing, NULL, NULL, thing->health, NAME_None, DMG_FORCED);  // kill object
			return true;
		}

		// Check for MF6_BUMPSPECIAL
		// By default, only players can activate things by bumping into them
		if ((thing->flags6 & MF6_BUMPSPECIAL) && ((tm.thing->player != NULL)
			|| ((thing->activationtype & THINGSPEC_MonsterTrigger) && (tm.thing->flags3 & MF3_ISMONSTER))
			|| ((thing->activationtype & THINGSPEC_MissileTrigger) && (tm.thing->flags & MF_MISSILE))
			) && (level.maptime > thing->lastbump)) // Leave the bumper enough time to go away
		{
			if (P_ActivateThingSpecial(thing, tm.thing))
				thing->lastbump = level.maptime + TICRATE;
		}
	}

	// Check for skulls slamming into things
	if (tm.thing->flags & MF_SKULLFLY)
	{
		bool res = tm.thing->CallSlam(tm.thing->BlockingMobj);
		tm.thing->BlockingMobj = NULL;
		return res;
	}

	// [ED850] Player Prediction ends here. There is nothing else they could/should do.
	if (tm.thing->player != NULL && (tm.thing->player->cheats & CF_PREDICTING))
	{
		solid = (thing->flags & MF_SOLID) &&
			!(thing->flags & MF_NOCLIP) &&
			((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

		return !solid || unblocking;
	}

	// Check for blasted thing running into another
	if ((tm.thing->flags2 & MF2_BLASTED) && (thing->flags & MF_SHOOTABLE))
	{
		if (!(thing->flags2 & MF2_BOSS) && (thing->flags3 & MF3_ISMONSTER) && !(thing->flags3 & MF3_DONTBLAST))
		{
			// ideally this should take the mass factor into account
			thing->Vel += tm.thing->Vel.XY();
			if (fabs(thing->Vel.X) + fabs(thing->Vel.Y) > 3.)
			{
				int newdam;
				damage = (tm.thing->Mass / 100) + 1;
				newdam = P_DamageMobj(thing, tm.thing, tm.thing, damage, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				damage = (thing->Mass / 100) + 1;
				newdam = P_DamageMobj(tm.thing, thing, thing, damage >> 2, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, tm.thing, thing);
			}
			return false;
		}
	}
	// Check for missile or non-solid MBF bouncer
	if (tm.thing->flags & MF_MISSILE || ((tm.thing->BounceFlags & BOUNCE_MBF) && !(tm.thing->flags & MF_SOLID)))
	{
		// Check for a non-shootable mobj
		if (thing->flags2 & MF2_NONSHOOTABLE)
		{
			return true;
		}
		// Check for passing through a ghost
		if ((thing->flags3 & MF3_GHOST) && (tm.thing->flags2 & MF2_THRUGHOST))
		{
			return true;
		}

		if ((tm.thing->flags6 & MF6_MTHRUSPECIES)
			&& tm.thing->target // NULL pointer check
			&& (tm.thing->target->GetSpecies() == thing->GetSpecies()))
			return true;

		// Check for rippers passing through corpses
		if ((thing->flags & MF_CORPSE) && (tm.thing->flags2 & MF2_RIP) && !(thing->flags & MF_SHOOTABLE))
		{
			return true;
		}

		double clipheight;

		if (thing->projectilepassheight > 0)
		{
			clipheight = thing->projectilepassheight;
		}
		else if (thing->projectilepassheight < 0 && (i_compatflags & COMPATF_MISSILECLIP))
		{
			clipheight = -thing->projectilepassheight;
		}
		else
		{
			clipheight = thing->Height;
		}

		// Check if it went over / under
		if (tm.thing->Z() > thing->Z() + clipheight)
		{ // Over thing
			return true;
		}
		if (tm.thing->Top() < thing->Z())
		{ // Under thing
			return true;
		}

		// [RH] What is the point of this check, again? In Hexen, it is unconditional,
		// but here we only do it if the missile's damage is 0.
		// MBF bouncer might have a non-0 damage value, but they must not deal damage on impact either.
		if ((tm.thing->BounceFlags & BOUNCE_Actors) && (tm.thing->IsZeroDamage() || !(tm.thing->flags & MF_MISSILE)))
		{
			return (tm.thing->target == thing || !(thing->flags & MF_SOLID));
		}

		switch (tm.thing->SpecialMissileHit(thing))
		{
		case 0:		return false;
		case 1:		return true;
		default:	break;
		}

		// [RH] Extend DeHacked infighting to allow for monsters
		// to never fight each other

		if (tm.thing->target != NULL)
		{
			if (thing == tm.thing->target)
			{ // Don't missile self
				return true;
			}

			if (!CanAttackHurt(thing, tm.thing->target))
			{
				return false;
			}
		}
		if (!(thing->flags & MF_SHOOTABLE))
		{ // Didn't do any damage
			return !(thing->flags & MF_SOLID);
		}
		if ((thing->flags4 & MF4_SPECTRAL) && !(tm.thing->flags4 & MF4_SPECTRAL))
		{
			return true;
		}

		if ((tm.DoRipping && !(thing->flags5 & MF5_DONTRIP)) && CheckRipLevel(thing, tm.thing))
		{
			if (!(tm.thing->flags6 & MF6_NOBOSSRIP) || !(thing->flags2 & MF2_BOSS))
			{
				bool *check = tm.LastRipped.CheckKey(thing);
				if (check == NULL || !*check)
				{
					tm.LastRipped[thing] = true;
					if (!(thing->flags & MF_NOBLOOD) &&
						!(thing->flags2 & MF2_REFLECTIVE) &&
						!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
						!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
					{ // Ok to spawn blood
						P_RipperBlood(tm.thing, thing);
					}
					S_Sound(tm.thing, CHAN_BODY, "misc/ripslop", 1, ATTN_IDLE);

					// Do poisoning (if using new style poison)
					if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
					{
						P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
					}

					damage = tm.thing->GetMissileDamage(3, 2);
					int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
					if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
					{
						P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
					}
					if (thing->flags2 & MF2_PUSHABLE
						&& !(tm.thing->flags2 & MF2_CANNOTPUSH))
					{ // Push thing
						if (thing->lastpush != tm.PushTime)
						{
							thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
							thing->lastpush = tm.PushTime;
						}
					}
				}
				spechit.Clear();
				return true;
			}
		}

		// Do poisoning (if using new style poison)
		if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
		{
			P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
		}

		// Do damage
		damage = tm.thing->GetMissileDamage((tm.thing->flags4 & MF4_STRIFEDAMAGE) ? 3 : 7, 1);
		if ((damage > 0) || (tm.thing->flags6 & MF6_FORCEPAIN) || (tm.thing->flags7 & MF7_CAUSEPAIN))
		{
			int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
			if (damage > 0)
			{
				if ((tm.thing->flags5 & MF5_BLOODSPLATTER) &&
					!(thing->flags & MF_NOBLOOD) &&
					!(thing->flags2 & MF2_REFLECTIVE) &&
					!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)) &&
					!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
					(pr_checkthing() < 192))
				{
					P_BloodSplatter(tm.thing->Pos(), thing, tm.thing->AngleTo(thing));
				}
				if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
				{
					P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				}
			}
		}
		else
		{
			P_GiveBody(thing, -damage);
		}

		if ((thing->flags7 & MF7_THRUREFLECT) && (thing->flags2 & MF2_REFLECTIVE) && (tm.thing->flags & MF_MISSILE))
		{
			if (tm.thing->flags2 & MF2_SEEKERMISSILE)
			{
				tm.thing->tracer = tm.thing->target;
			}
			tm.thing->target = thing;
			return true;
		}
		return false;		// don't traverse any more
	}
	if (thing->flags2 & MF2_PUSHABLE && !(tm.thing->flags2 & MF2_CANNOTPUSH))
	{ // Push thing
		if (thing->lastpush != tm.PushTime)
		{
			thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
			thing->lastpush = tm.PushTime;
		}
	}
	solid = (thing->flags & MF_SOLID) &&
		!(thing->flags & MF_NOCLIP) &&
		((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

	// Check for special pickup
	if ((thing->flags & MF_SPECIAL) && (tm.thing->flags & MF_PICKUP)
		// [RH] The next condition is to compensate for the extra height
		// that gets added by P_CheckPosition() so that you cannot pick
		// up things that are above your true height.
		&& thing->Z() < tm.thing->Top() - tm.thing->MaxStepHeight)
	{ // Can be picked up by tmthing
		P_TouchSpecialThing(thing, tm.thing);	// can remove thing
	}

	// killough 3/16/98: Allow non-solid moving objects to move through solid
	// ones, by allowing the moving thing (tmthing) to move if it's non-solid,
	// despite another solid thing being in the way.
	// killough 4/11/98: Treat no-clipping things as not blocking

	return !solid || unblocking;

	// return !(thing->flags & MF_SOLID);	// old code -- killough
}